

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O0

int mbedtls_ecjpake_derive_secret
              (mbedtls_ecjpake_context *ctx,uchar *buf,size_t len,size_t *olen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  byte bVar1;
  ulong buflen;
  size_t x_bytes;
  uchar kx [32];
  mbedtls_ecp_point K;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t *olen_local;
  size_t len_local;
  uchar *buf_local;
  mbedtls_ecjpake_context *ctx_local;
  
  bVar1 = mbedtls_md_get_size_from_type(ctx->md_type);
  *olen = (ulong)bVar1;
  if (len < *olen) {
    ctx_local._4_4_ = -0x4f00;
  }
  else {
    mbedtls_ecp_point_init((mbedtls_ecp_point *)(kx + 0x18));
    K.Z._12_4_ = mbedtls_ecjpake_derive_k(ctx,(mbedtls_ecp_point *)(kx + 0x18),f_rng,p_rng);
    if (K.Z._12_4_ == 0) {
      buflen = (ctx->grp).pbits + 7 >> 3;
      K.Z._12_4_ = mbedtls_mpi_write_binary((mbedtls_mpi *)(kx + 0x18),(uchar *)&x_bytes,buflen);
      if (K.Z._12_4_ == 0) {
        K.Z._12_4_ = mbedtls_ecjpake_compute_hash(ctx->md_type,(uchar *)&x_bytes,buflen,buf);
      }
    }
    mbedtls_ecp_point_free((mbedtls_ecp_point *)(kx + 0x18));
    ctx_local._4_4_ = K.Z._12_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_ecjpake_derive_secret(mbedtls_ecjpake_context *ctx,
                                  unsigned char *buf, size_t len, size_t *olen,
                                  int (*f_rng)(void *, unsigned char *, size_t),
                                  void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecp_point K;
    unsigned char kx[MBEDTLS_ECP_MAX_BYTES];
    size_t x_bytes;

    *olen = mbedtls_md_get_size_from_type(ctx->md_type);
    if (len < *olen) {
        return MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
    }

    mbedtls_ecp_point_init(&K);

    ret = mbedtls_ecjpake_derive_k(ctx, &K, f_rng, p_rng);
    if (ret) {
        goto cleanup;
    }

    /* PMS = SHA-256( K.X ) */
    x_bytes = (ctx->grp.pbits + 7) / 8;
    MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&K.X, kx, x_bytes));
    MBEDTLS_MPI_CHK(mbedtls_ecjpake_compute_hash(ctx->md_type,
                                                 kx, x_bytes, buf));

cleanup:
    mbedtls_ecp_point_free(&K);

    return ret;
}